

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_int>
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,uint n)

{
  byte bVar1;
  bool bVar2;
  limb_type val;
  uint uVar3;
  const_iterator puVar4;
  uint *puVar5;
  uint *last;
  iterator puVar6;
  reference pvVar7;
  uint local_94;
  local_integral_type left_shift_previous_value;
  uint local_54;
  reverse_iterator rStack_50;
  value_type_conflict t;
  reverse_iterator<unsigned_int_*> local_48;
  reverse_iterator r_ai;
  limb_type part_from_previous_value;
  uint_fast16_t right_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  uintwide_t<512U,_unsigned_int,_void,_false> *puStack_10;
  uint n_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_28 = (ulong)(n >> 5);
  right_shift_amount = 0x10;
  offset._4_4_ = n;
  puStack_10 = this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&right_shift_amount);
  uVar3 = offset._4_4_ & 0x1f;
  bVar1 = (byte)offset._4_4_ & 0x1f;
  if ((int)local_20 != 0) {
    puVar4 = detail::array_detail::array<unsigned_int,_16UL>::cbegin
                       ((array<unsigned_int,_16UL> *)this);
    puVar5 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar4,(uint)local_20);
    puVar4 = detail::array_detail::array<unsigned_int,_16UL>::cbegin
                       ((array<unsigned_int,_16UL> *)this);
    last = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar4,0x10);
    puVar6 = detail::array_detail::array<unsigned_int,_16UL>::begin
                       ((array<unsigned_int,_16UL> *)this);
    detail::copy_unsafe<unsigned_int_const*,unsigned_int*>(puVar5,last,puVar6);
    puVar6 = detail::array_detail::array<unsigned_int,_16UL>::begin
                       ((array<unsigned_int,_16UL> *)this);
    puVar5 = detail::advance_and_point<unsigned_int*,unsigned_int>(puVar6,0x10 - (int)local_20);
    puVar6 = detail::array_detail::array<unsigned_int,_16UL>::end((array<unsigned_int,_16UL> *)this)
    ;
    val = right_shift_fill_value(this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(puVar5,puVar6,val);
  }
  if (uVar3 != 0) {
    bVar2 = is_neg<false>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                          (enable_if_t<(_false),_int> *)0x0);
    if (bVar2) {
      local_94 = std::numeric_limits<unsigned_int>::max();
      local_94 = local_94 << (0x20 - bVar1 & 0x1f);
    }
    else {
      local_94 = 0;
    }
    r_ai.current._4_4_ = local_94;
    puVar6 = detail::array_detail::array<unsigned_int,_16UL>::begin
                       ((array<unsigned_int,_16UL> *)this);
    puVar5 = detail::advance_and_point<unsigned_int*,long>(puVar6,0x10 - local_20);
    detail::iterator_detail::reverse_iterator<unsigned_int_*>::reverse_iterator(&local_48,puVar5);
    while( true ) {
      rStack_50 = detail::array_detail::array<unsigned_int,_16UL>::rend
                            ((array<unsigned_int,_16UL> *)this);
      bVar2 = detail::iterator_detail::operator!=(&local_48,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      pvVar7 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*(&local_48);
      local_54 = *pvVar7;
      uVar3 = local_54 >> bVar1 | r_ai.current._4_4_;
      left_shift_previous_value =
           (local_integral_type)
           detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator++(&local_48,0);
      pvVar7 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*
                         ((reverse_iterator<unsigned_int_*> *)&left_shift_previous_value);
      *pvVar7 = uVar3;
      r_ai.current._4_4_ = local_54 << (0x20 - bVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }